

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

DistItemBaseSyntax * __thiscall slang::parsing::Parser::parseDistItem(Parser *this)

{
  LanguageVersion LVar1;
  bool bVar2;
  Diagnostic *pDVar3;
  ExpressionSyntax *range;
  ExpressionSyntax *expr;
  DistWeightSyntax *weight;
  DistItemSyntax *pDVar4;
  SourceLocation SVar5;
  DefaultDistItemSyntax *pDVar6;
  undefined8 uVar7;
  char *pcVar8;
  size_t sVar9;
  string_view arg;
  Token extraOp;
  SourceRange SVar10;
  Token op;
  Token TVar11;
  string_view sVar12;
  Token op2;
  Token op1;
  Token local_78;
  Info *local_68;
  Token local_60;
  Token local_50;
  Token local_40;
  
  Token::Token(&local_78);
  bVar2 = ParserBase::peek(&this->super_ParserBase,DefaultKeyword);
  if (bVar2) {
    local_78 = ParserBase::consume(&this->super_ParserBase);
    if ((int)(this->parseOptions).languageVersion < 1) {
      SVar10 = Token::range(&local_78);
      pDVar3 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x20001,SVar10);
      LVar1 = (this->parseOptions).languageVersion;
      sVar9 = 9;
      if (LVar1 == Default) {
        pcVar8 = "1800-2017";
      }
      else if (LVar1 == v1800_2023) {
        pcVar8 = "1800-2023";
      }
      else {
        pcVar8 = "";
        sVar9 = 0;
      }
      sVar12._M_str = pcVar8;
      sVar12._M_len = sVar9;
      Diagnostic::operator<<(pDVar3,sVar12);
    }
    range = (ExpressionSyntax *)0x0;
  }
  else {
    range = parseValueRangeElement(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
  }
  bVar2 = ParserBase::peek(&this->super_ParserBase,ColonEquals);
  if ((bVar2) || (bVar2 = ParserBase::peek(&this->super_ParserBase,ColonSlash), bVar2)) {
    op = ParserBase::consume(&this->super_ParserBase);
    Token::Token(&local_40);
    expr = parseExpression(this);
    uVar7 = local_40._0_8_;
LAB_001e78c4:
    extraOp.info = local_40.info;
    extraOp.kind = (TokenKind)uVar7;
    extraOp._2_1_ = SUB81(uVar7,2);
    extraOp.numFlags.raw = SUB81(uVar7,3);
    extraOp.rawLen = SUB84(uVar7,4);
    weight = syntax::SyntaxFactory::distWeight(&this->factory,op,extraOp,expr);
  }
  else {
    bVar2 = ParserBase::peek(&this->super_ParserBase,Colon);
    if ((bVar2) &&
       ((TVar11 = ParserBase::peek(&this->super_ParserBase,1), TVar11.kind == Equals ||
        (TVar11 = ParserBase::peek(&this->super_ParserBase,1), TVar11.kind == Slash)))) {
      local_50 = ParserBase::consume(&this->super_ParserBase);
      local_60 = ParserBase::consume(&this->super_ParserBase);
      SVar10 = Token::range(&local_50);
      pDVar3 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xca0005,SVar10);
      SVar10 = Token::range(&local_60);
      Diagnostic::operator<<(pDVar3,SVar10);
      op = local_50;
      uVar7 = local_60._0_8_;
      local_68 = local_60.info;
      expr = parseExpression(this);
      local_40.info = local_68;
      goto LAB_001e78c4;
    }
    weight = (DistWeightSyntax *)0x0;
  }
  if (range != (ExpressionSyntax *)0x0) {
    pDVar4 = syntax::SyntaxFactory::distItem(&this->factory,range,weight);
    return &pDVar4->super_DistItemBaseSyntax;
  }
  if (weight == (DistWeightSyntax *)0x0) {
    SVar5 = Token::location(&local_78);
    sVar12 = Token::rawText(&local_78);
    SVar5 = (SourceLocation)(sVar12._M_len * 0x10000000 + (long)SVar5);
  }
  else {
    if (((weight->op).kind == ColonSlash) || ((weight->extraOp).kind == Slash)) goto LAB_001e7a3c;
    SVar5 = Token::location(&weight->op);
  }
  pDVar3 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x550005,SVar5);
  arg._M_str = ":/";
  arg._M_len = 2;
  Diagnostic::operator<<(pDVar3,arg);
LAB_001e7a3c:
  pDVar6 = syntax::SyntaxFactory::defaultDistItem(&this->factory,local_78,weight);
  return &pDVar6->super_DistItemBaseSyntax;
}

Assistant:

DistItemBaseSyntax& Parser::parseDistItem() {
    Token defaultKeyword;
    ExpressionSyntax* elem = nullptr;
    if (peek(TokenKind::DefaultKeyword)) {
        defaultKeyword = consume();
        if (parseOptions.languageVersion < LanguageVersion::v1800_2023) {
            addDiag(diag::WrongLanguageVersion, defaultKeyword.range())
                << toString(parseOptions.languageVersion);
        }
    }
    else {
        elem = &parseValueRangeElement();
    }

    DistWeightSyntax* weight = nullptr;
    if (peek(TokenKind::ColonEquals) || peek(TokenKind::ColonSlash)) {
        auto op = consume();
        weight = &factory.distWeight(op, Token(), parseExpression());
    }
    else if (peek(TokenKind::Colon) &&
             (peek(1).kind == TokenKind::Equals || peek(1).kind == TokenKind::Slash)) {
        // VCS allows the dist weight operators to be split, so allow this with a diagnostic
        // for compat purposes.
        auto op1 = consume();
        auto op2 = consume();
        addDiag(diag::SplitDistWeightOp, op1.range()) << op2.range();
        weight = &factory.distWeight(op1, op2, parseExpression());
    }

    if (elem)
        return factory.distItem(*elem, weight);

    if (!weight ||
        (weight->op.kind != TokenKind::ColonSlash && weight->extraOp.kind != TokenKind::Slash)) {
        auto loc = weight ? weight->op.location()
                          : defaultKeyword.location() + defaultKeyword.rawText().length();
        addDiag(diag::ExpectedToken, loc) << ":/"sv;
    }

    return factory.defaultDistItem(defaultKeyword, weight);
}